

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::XmlWriter::ensureTagClosed(XmlWriter *this)

{
  if (this->m_tagIsOpen == true) {
    std::operator<<(this->m_os,'>');
    std::ostream::flush();
    newlineIfNecessary(this);
    this->m_tagIsOpen = false;
  }
  return;
}

Assistant:

void XmlWriter::ensureTagClosed() {
        if( m_tagIsOpen ) {
            m_os << '>' << std::flush;
            newlineIfNecessary();
            m_tagIsOpen = false;
        }
    }